

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

QRenderRule * __thiscall
QStyleSheetStyle::renderRule
          (QRenderRule *__return_storage_ptr__,QStyleSheetStyle *this,QObject *obj,int element,
          quint64 state)

{
  Span *pSVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  QHash<int,_QHash<unsigned_long_long,_QRenderRule>_> *this_00;
  QStyleSheetStyle *this_01;
  ulong uVar5;
  QRenderRule *pQVar6;
  qsizetype qVar7;
  ulong uVar8;
  QStyleSheetStyle *this_02;
  long lVar9;
  int i;
  undefined1 *puVar10;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  const_iterator cVar11;
  ulong local_b0;
  QArrayDataPointer<QCss::Declaration> local_a8;
  quint64 negated;
  char16_t *pcStack_80;
  undefined1 *local_78;
  quint64 state_local;
  int element_local;
  QObject *obj_local;
  QArrayDataPointer<QCss::StyleRule> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  state_local = state;
  element_local = element;
  obj_local = obj;
  if (obj != (QObject *)0x0) {
    (*(code *)**(undefined8 **)obj)(obj);
    pcVar4 = (char *)QMetaObject::className();
    iVar3 = qstrcmp(pcVar4,"QDockWidgetTitleButton");
    if (iVar3 == 0) {
      QObject::objectName();
      negated = 0x19;
      pcStack_80 = L"qt_dockwidget_closebutton";
      bVar2 = ::operator==((QString *)&local_58,(QLatin1StringView *)&negated);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
      if (bVar2) {
        element_local = 0x3b;
      }
      else {
        QObject::objectName();
        negated = 0x19;
        pcStack_80 = L"qt_dockwidget_floatbutton";
        bVar2 = ::operator==((QString *)&local_58,(QLatin1StringView *)&negated);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
        if (bVar2) {
          element_local = 0x3c;
        }
      }
      obj_local = *(QObject **)(*(long *)(obj + 8) + 0x10);
    }
  }
  this_00 = QHash<const_QObject_*,_QHash<int,_QHash<unsigned_long_long,_QRenderRule>_>_>::operator[]
                      (&styleSheetCaches->renderRulesCache,&obj_local);
  this_01 = (QStyleSheetStyle *)
            QHash<int,_QHash<unsigned_long_long,_QRenderRule>_>::operator[](this_00,&element_local);
  this_02 = this_01;
  cVar11 = QHash<unsigned_long_long,_QRenderRule>::constFindImpl<unsigned_long_long>
                     ((QHash<unsigned_long_long,_QRenderRule> *)this_01,&state_local);
  if (cVar11.i.d == (Data<QHashPrivate::Node<unsigned_long_long,_QRenderRule>_> *)0x0 &&
      cVar11.i.bucket == 0) {
    bVar2 = initObject(this_02,obj_local);
    if (bVar2) {
      local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.ptr = (StyleRule *)&DAT_aaaaaaaaaaaaaaaa;
      styleRules((QList<QCss::StyleRule> *)&local_58,this,obj_local);
      lVar9 = 8;
      uVar8 = 0;
      for (puVar10 = (undefined1 *)0x0; puVar10 < (ulong)local_58.size; puVar10 = puVar10 + 1) {
        negated = 0;
        uVar5 = QCss::Selector::pseudoClass
                          (*(ulonglong **)((long)&((local_58.ptr)->selectors).d.d + lVar9));
        uVar8 = uVar8 | uVar5 | negated;
        lVar9 = lVar9 + 0x38;
      }
      negated = state_local & uVar8;
      cVar11 = QHash<unsigned_long_long,_QRenderRule>::constFindImpl<unsigned_long_long>
                         ((QHash<unsigned_long_long,_QRenderRule> *)this_01,&negated);
      if (cVar11.i.d == (Data<QHashPrivate::Node<unsigned_long_long,_QRenderRule>_> *)0x0 &&
          cVar11.i.bucket == 0) {
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        negated = (quint64)&DAT_aaaaaaaaaaaaaaaa;
        pcStack_80 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        lVar9 = (long)element_local;
        qVar7 = QtPrivate::lengthHelperPointer<char>(knownPseudoElements[lVar9].name);
        latin1.m_data = knownPseudoElements[lVar9].name;
        latin1.m_size = qVar7;
        QString::QString((QString *)&negated,latin1);
        local_a8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_a8.ptr = (Declaration *)&DAT_aaaaaaaaaaaaaaaa;
        declarations((QList<QCss::Declaration> *)&local_a8,(QList<QCss::StyleRule> *)&local_58,
                     (QString *)&negated,state_local);
        memset(__return_storage_ptr__,0xaa,0x88);
        QRenderRule::QRenderRule
                  (__return_storage_ptr__,(QList<QCss::Declaration> *)&local_a8,obj_local);
        pQVar6 = QHash<unsigned_long_long,_QRenderRule>::operator[]
                           ((QHash<unsigned_long_long,_QRenderRule> *)this_01,&state_local);
        QRenderRule::operator=(pQVar6,__return_storage_ptr__);
        if ((uVar8 & state_local) != state_local) {
          local_b0 = uVar8 & state_local;
          pQVar6 = QHash<unsigned_long_long,_QRenderRule>::operator[]
                             ((QHash<unsigned_long_long,_QRenderRule> *)this_01,&local_b0);
          QRenderRule::operator=(pQVar6,__return_storage_ptr__);
        }
        QArrayDataPointer<QCss::Declaration>::~QArrayDataPointer(&local_a8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&negated);
      }
      else {
        memset(__return_storage_ptr__,0xaa,0x88);
        pSVar1 = (cVar11.i.d)->spans;
        uVar8 = cVar11.i.bucket >> 7;
        QRenderRule::QRenderRule
                  (__return_storage_ptr__,
                   (QRenderRule *)
                   (pSVar1[uVar8].entries[pSVar1[uVar8].offsets[(uint)cVar11.i.bucket & 0x7f]].
                    storage.data + 8));
        pQVar6 = QHash<unsigned_long_long,_QRenderRule>::operator[]
                           ((QHash<unsigned_long_long,_QRenderRule> *)this_01,&state_local);
        QRenderRule::operator=(pQVar6,__return_storage_ptr__);
      }
      QArrayDataPointer<QCss::StyleRule>::~QArrayDataPointer(&local_58);
    }
    else {
      QRenderRule::QRenderRule(__return_storage_ptr__);
    }
  }
  else {
    pSVar1 = (cVar11.i.d)->spans;
    uVar8 = cVar11.i.bucket >> 7;
    QRenderRule::QRenderRule
              (__return_storage_ptr__,
               (QRenderRule *)
               (pSVar1[uVar8].entries[pSVar1[uVar8].offsets[(uint)cVar11.i.bucket & 0x7f]].storage.
                data + 8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QRenderRule QStyleSheetStyle::renderRule(const QObject *obj, int element, quint64 state) const
{
    qt_check_if_internal_object(&obj, &element);
    QHash<quint64, QRenderRule> &cache = styleSheetCaches->renderRulesCache[obj][element];
    QHash<quint64, QRenderRule>::const_iterator cacheIt = cache.constFind(state);
    if (cacheIt != cache.constEnd())
        return cacheIt.value();

    if (!initObject(obj))
        return QRenderRule();

    quint64 stateMask = 0;
    const QList<StyleRule> rules = styleRules(obj);
    for (int i = 0; i < rules.size(); i++) {
        const Selector& selector = rules.at(i).selectors.at(0);
        quint64 negated = 0;
        stateMask |= selector.pseudoClass(&negated);
        stateMask |= negated;
    }

    cacheIt = cache.constFind(state & stateMask);
    if (cacheIt != cache.constEnd()) {
        QRenderRule newRule = cacheIt.value();
        cache[state] = newRule;
        return newRule;
    }


    const QString part = QLatin1StringView(knownPseudoElements[element].name);
    QList<Declaration> decls = declarations(rules, part, state);
    QRenderRule newRule(decls, obj);
    cache[state] = newRule;
    if ((state & stateMask) != state)
        cache[state&stateMask] = newRule;
    return newRule;
}